

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void __thiscall ThirdTag::ThirdTag(ThirdTag *this,tag_t<cfgfile::string_trait_t> *owner)

{
  string_t local_40;
  
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"thirdTag","");
  cfgfile::tag_t<cfgfile::string_trait_t>::tag_t
            (&this->super_tag_t<cfgfile::string_trait_t>,owner,&local_40,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  (this->super_tag_t<cfgfile::string_trait_t>)._vptr_tag_t = (_func_int **)&PTR__tag_t_001645e8;
  this->m_started = false;
  this->m_finished = false;
  this->m_withString = false;
  return;
}

Assistant:

explicit ThirdTag( tag_t<> & owner )
		:	cfgfile::tag_t<>( owner, "thirdTag", false )
		,	m_started( false )
		,	m_finished( false )
		,	m_withString( false )
	{
	}